

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_MinMaxLoc_Test::TestBody(MxxReduce_MinMaxLoc_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  pair<double,_int> pVar4;
  AssertHelper local_140;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  int local_cc;
  pair<int,_int> local_c8;
  pair<int,_int> minloc;
  Message local_b8;
  double local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  double local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  pair<double,_int> maxloc;
  comm c;
  MxxReduce_MinMaxLoc_Test *this_local;
  
  mxx::comm::comm((comm *)&maxloc.second);
  iVar2 = mxx::comm::rank((comm *)&maxloc.second);
  local_48 = (double)iVar2 * 3.1;
  pVar4 = mxx::max_element<double>(&local_48,(comm *)&maxloc.second);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar4.first;
  maxloc.first._0_4_ = pVar4.second;
  local_40 = gtest_ar.message_.ptr_;
  local_7c = mxx::comm::size((comm *)&maxloc.second);
  local_7c = local_7c + -1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_78,"c.size()-1","maxloc.second",&local_7c,(int *)&maxloc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x133,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    iVar2 = mxx::comm::size((comm *)&maxloc.second);
    local_b0 = (double)(iVar2 + -1) * 3.1;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_a8,"3.1*(c.size()-1)","maxloc.first",&local_b0,
               (double *)&local_40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&minloc,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
                 ,0x134,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&minloc,&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&minloc);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_cc = mxx::comm::rank((comm *)&maxloc.second);
      local_cc = local_cc + 0xd;
      mxx::comm::comm((comm *)&gtest_ar_2.message_);
      local_c8 = mxx::min_element<int>(&local_cc,(comm *)&gtest_ar_2.message_);
      mxx::comm::~comm((comm *)&gtest_ar_2.message_);
      local_104 = 0xd;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_100,"13","minloc.first",&local_104,&local_c8.first);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_110);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
                   ,0x137,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_110);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_12c = 0;
        testing::internal::EqHelper<true>::Compare<int,int>
                  (local_128,"0",(int *)"minloc.second",&local_12c,&local_c8.second);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
        if (!bVar1) {
          testing::Message::Message(&local_138);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
                     ,0x138,pcVar3);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          testing::Message::~Message(&local_138);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  mxx::comm::~comm((comm *)&maxloc.second);
  return;
}

Assistant:

TEST(MxxReduce, MinMaxLoc) {
    mxx::comm c;

    std::pair<double, int> maxloc = mxx::max_element(3.1*c.rank(), c);
    ASSERT_EQ(c.size()-1, maxloc.second);
    ASSERT_EQ(3.1*(c.size()-1), maxloc.first);

    std::pair<int, int> minloc = mxx::min_element(c.rank()+13);
    ASSERT_EQ(13, minloc.first);
    ASSERT_EQ(0, minloc.second);
}